

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

NodePtr avro::makeArrayNode(Entity *e,Object *m,SymbolTable *st,string *ns)

{
  shared_ptr<avro::Node> *in_RDX;
  shared_count extraout_RDX;
  shared_ptr<avro::Node> *in_RSI;
  element_type *in_RDI;
  NodePtr NVar1;
  string *in_stack_00000068;
  Object *in_stack_00000070;
  string *in_stack_00000078;
  SymbolTable *in_stack_00000080;
  Entity *in_stack_00000088;
  const_iterator it;
  element_type *this;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [32];
  _Base_ptr local_30;
  
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  local_30 = (_Base_ptr)findField((Entity *)in_stack_00000078,in_stack_00000070,in_stack_00000068);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  operator_new(0x28);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                *)0x234519);
  makeNode(in_stack_00000088,in_stack_00000080,in_stack_00000078);
  asSingleAttribute<boost::shared_ptr<avro::Node>>(in_RSI);
  NodeArray::NodeArray((NodeArray *)this,(SingleLeaf *)in_RDI);
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeArray>(in_RDX,(NodeArray *)in_RSI);
  concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>::~SingleAttribute
            ((SingleAttribute<boost::shared_ptr<avro::Node>_> *)0x23457c);
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x234586);
  NVar1.pn.pi_ = extraout_RDX.pi_;
  NVar1.px = this;
  return NVar1;
}

Assistant:

static NodePtr makeArrayNode(const Entity& e, const Object& m,
    SymbolTable& st, const string& ns)
{
    Object::const_iterator it = findField(e, m, "items");
    return NodePtr(new NodeArray(asSingleAttribute(
        makeNode(it->second, st, ns))));
}